

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
::InnerMap::InsertUnique(iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  void *pvVar1;
  bool bVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  LogFinisher local_91;
  Node *local_90;
  InnerMap *pIStack_88;
  ulong local_80;
  Node *local_58;
  InnerMap *pIStack_50;
  iterator local_40;
  
  if ((this->index_of_first_non_null_ != this->num_buckets_) &&
     (this->table_[this->index_of_first_non_null_] == (void *)0x0)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x326);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_90,
                        "CHECK failed: index_of_first_non_null_ == num_buckets_ || table_[index_of_first_non_null_] != nullptr: "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)&local_90);
  }
  Map<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>::InnerMap::
  find<std::__cxx11::string>
            (&local_40,(InnerMap *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node);
  if (local_40.node_ != (Node *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x32c);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_90,"CHECK failed: find(node->kv.first) == end(): ");
    internal::LogFinisher::operator=(&local_91,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)&local_90);
  }
  pvVar1 = this->table_[b];
  if (pvVar1 == (void *)0x0) {
    InsertUniqueInList((iterator *)&local_90,this,b,node);
    local_58 = local_90;
    pIStack_50 = pIStack_88;
  }
  else {
    if (pvVar1 == this->table_[b ^ 1]) {
      InsertUniqueInTree(__return_storage_ptr__,this,b,node);
      return __return_storage_ptr__;
    }
    bVar2 = TableEntryIsTooLong(this,b);
    if (!bVar2) {
      InsertUniqueInList(__return_storage_ptr__,this,b,node);
      return __return_storage_ptr__;
    }
    TreeConvert(this,b);
    InsertUniqueInTree((iterator *)&local_90,this,b,node);
    local_58 = local_90;
    pIStack_50 = pIStack_88;
    if (local_80 != (b & 0xfffffffffffffffe)) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x333);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)&local_90,
                          "CHECK failed: (result.bucket_index_) == (b & ~static_cast<size_type>(1)): "
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)&local_90);
    }
  }
  uVar4 = this->index_of_first_non_null_;
  if (local_80 < this->index_of_first_non_null_) {
    uVar4 = local_80;
  }
  this->index_of_first_non_null_ = uVar4;
  __return_storage_ptr__->node_ = local_58;
  __return_storage_ptr__->m_ = pIStack_50;
  __return_storage_ptr__->bucket_index_ = local_80;
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUnique(size_type b, Node* node) {
      GOOGLE_DCHECK(index_of_first_non_null_ == num_buckets_ ||
             table_[index_of_first_non_null_] != nullptr);
      // In practice, the code that led to this point may have already
      // determined whether we are inserting into an empty list, a short list,
      // or whatever.  But it's probably cheap enough to recompute that here;
      // it's likely that we're inserting into an empty or short list.
      iterator result;
      GOOGLE_DCHECK(find(node->kv.first) == end());
      if (TableEntryIsEmpty(b)) {
        result = InsertUniqueInList(b, node);
      } else if (TableEntryIsNonEmptyList(b)) {
        if (PROTOBUF_PREDICT_FALSE(TableEntryIsTooLong(b))) {
          TreeConvert(b);
          result = InsertUniqueInTree(b, node);
          GOOGLE_DCHECK_EQ(result.bucket_index_, b & ~static_cast<size_type>(1));
        } else {
          // Insert into a pre-existing list.  This case cannot modify
          // index_of_first_non_null_, so we skip the code to update it.
          return InsertUniqueInList(b, node);
        }
      } else {
        // Insert into a pre-existing tree.  This case cannot modify
        // index_of_first_non_null_, so we skip the code to update it.
        return InsertUniqueInTree(b, node);
      }
      // parentheses around (std::min) prevents macro expansion of min(...)
      index_of_first_non_null_ =
          (std::min)(index_of_first_non_null_, result.bucket_index_);
      return result;
    }